

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

void borg_cheat_store(void)

{
  char cVar1;
  ushort uVar2;
  object *obj;
  bool bVar3;
  bool bVar4;
  borg_shop *pbVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  object **list;
  ulong uVar9;
  long lVar10;
  char *__s;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  store_conflict *store;
  char buf [120];
  long local_c0;
  long local_a8;
  short local_a0;
  
  list = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  if (z_info->store_max != 0) {
    lVar13 = 8;
    local_c0 = 0x68;
    uVar11 = 0;
    do {
      store = stores + uVar11;
      uVar2 = z_info->store_inven_max;
      if (uVar2 != 0) {
        __s = borg_shops->ware[0].desc + lVar13 + -8;
        uVar9 = 0;
        do {
          memset(__s,0,0x388);
          uVar9 = uVar9 + 1;
          uVar2 = z_info->store_inven_max;
          __s = __s + 0x388;
        } while (uVar9 < uVar2);
      }
      store_stock_list(store,list,(uint)uVar2);
      if (z_info->store_inven_max != 0) {
        uVar9 = 0;
        lVar10 = local_c0;
        do {
          pbVar5 = borg_shops;
          obj = list[uVar9];
          if (obj == (object *)0x0) break;
          object_desc((char *)&local_a8,0x78,obj,7,player);
          bVar3 = local_a0 == 0x29;
          bVar4 = local_a8 == 0x676e6968746f6e28;
          if (bVar3 && bVar4) break;
          borg_item_analyze((borg_item *)(pbVar5->ware[0].desc + lVar10 + -0x68),obj,
                            (char *)&local_a8,uVar11 != 7);
          if (uVar11 == 0) {
            cVar1 = pbVar5->ware[0].desc[lVar10 + -8];
            if (cVar1 == '\x13') {
              if (sv_light_torch == (uint)borg_items[(ulong)z_info->pack_size + 5].sval) {
                borg_fuel_onsale = (wchar_t)(byte)pbVar5->ware[0].desc[lVar10 + -4];
              }
            }
            else if (cVar1 == '\x1b') {
              if (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval) {
                borg_fuel_onsale = (wchar_t)(byte)pbVar5->ware[0].desc[lVar10 + -4];
              }
            }
            else if ((cVar1 == '\x1c') &&
                    (sv_food_ration == (uint)(byte)pbVar5->ware[0].desc[lVar10 + -7])) {
              borg_food_onsale = (wchar_t)(byte)pbVar5->ware[0].desc[lVar10 + -4];
            }
          }
          iVar12 = 0;
          if (f_info[0xe].shopnum - 1 != uVar11) {
            tval_can_have_charges(obj);
            wVar6 = object_value_real(obj,L'\x01');
            wVar7 = object_value(obj,L'\x01');
            if (wVar7 < wVar6) {
              wVar6 = object_value(obj,L'\x01');
            }
            else {
              wVar6 = object_value_real(obj,L'\x01');
            }
            iVar12 = 0;
            if (L'\0' < wVar6) {
              iVar8 = 100;
              if (f_info[0xd].shopnum - 1 == uVar11) {
                iVar8 = 0x96;
              }
              tval_can_have_charges(obj);
              wVar6 = object_value_real(obj,L'\x01');
              iVar8 = (wVar6 << (f_info[0xd].shopnum - 1 == uVar11)) * iVar8;
              uVar14 = SUB168(SEXT816((long)iVar8 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) +
                       (long)iVar8 + 0x32;
              iVar12 = (int)(uVar14 >> 6) - (int)((long)uVar14 >> 0x3f);
              tval_can_have_charges(obj);
              if (iVar8 < 0x32) {
                iVar12 = 1;
              }
            }
          }
          *(int *)(pbVar5->ware[0].desc + lVar10 + 0x18) = iVar12;
          if (bVar3 && bVar4) break;
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x388;
        } while (uVar9 < z_info->store_inven_max);
      }
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x54c8;
      local_c0 = local_c0 + 0x54c8;
    } while (uVar11 < z_info->store_max);
  }
  mem_free(list);
  return;
}

Assistant:

void borg_cheat_store(void)
{
    int             slot, i;
    int             store_num;
    struct object*  o_ptr;
    struct object** list
        = mem_zalloc(sizeof(struct object*) * z_info->store_inven_max);

    /* Scan each store */
    for (store_num = 0; store_num < z_info->store_max; store_num++) {
        struct store* st_ptr = &stores[store_num];

        /* Clear the Inventory from memory */
        for (i = 0; i < z_info->store_inven_max; i++) {
            /* Wipe the ware */
            memset(&borg_shops[store_num].ware[i], 0, sizeof(borg_item));
        }

        store_stock_list(st_ptr, list, z_info->store_inven_max);

        /* Check each existing object in this store */
        for (slot = 0; slot < z_info->store_inven_max && list[slot]; slot++) {
            o_ptr             = list[slot];
            borg_item* b_item = &borg_shops[store_num].ware[slot];
            char       buf[120];

            /* Describe the item */
            object_desc(
                buf, sizeof(buf), o_ptr, ODESC_FULL | ODESC_STORE, player);
            if (streq(buf, "(nothing)"))
                break;

            /* Analyze the item */
            borg_item_analyze(
                b_item, o_ptr, buf, store_num == 7 ? false : true);

            /* Check if the general store has certain items */
            if (store_num == 0) {
                /* Food -- needed for money scumming */
                if (b_item->tval == TV_FOOD && b_item->sval == sv_food_ration)
                    borg_food_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_FLASK
                    && borg_items[INVEN_LIGHT].sval == sv_light_lantern)
                    borg_fuel_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_LIGHT
                    && borg_items[INVEN_LIGHT].sval == sv_light_torch)
                    borg_fuel_onsale = b_item->iqty;
            }

            /* Hack -- Save the declared cost */
            b_item->cost = borg_price_item(o_ptr, false, 1, store_num);
        }
    }
    mem_free(list);
}